

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

string * __thiscall
stackjit::Runtime::Internal::valueToString_abi_cxx11_
          (string *__return_storage_ptr__,Internal *this,RegisterValue value,Type *type)

{
  size_t __n;
  char cVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  long *plVar5;
  size_type *psVar6;
  PrimitiveTypes primitiveType;
  int floatPattern;
  bool bVar7;
  stringstream stringstream;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream local_1b0 [16];
  long local_1a0 [3];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  cVar1 = (**(code **)(*(long *)value + 0x10))(value);
  if (cVar1 == '\0') {
    psVar4 = Type::name_abi_cxx11_((Type *)value);
    TypeSystem::toString_abi_cxx11_(&local_1f0,(TypeSystem *)0x2,primitiveType);
    __n = psVar4->_M_string_length;
    if (__n == local_1f0._M_string_length) {
      if (__n == 0) {
        bVar7 = true;
      }
      else {
        iVar2 = bcmp((psVar4->_M_dataplus)._M_p,local_1f0._M_dataplus._M_p,__n);
        bVar7 = iVar2 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if (bVar7) {
      std::ostream::_M_insert<double>((double)SUB84(this,0));
    }
    else {
      std::ostream::_M_insert<long>((long)local_1a0);
    }
  }
  else if (this == (Internal *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"nullref",7);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"0x",2);
    *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<long>((long)local_1a0);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  }
  psVar4 = Type::name_abi_cxx11_((Type *)value);
  std::operator+(&local_1d0," (",psVar4);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_1f0.field_2._M_allocated_capacity = *psVar6;
    local_1f0.field_2._8_8_ = plVar5[3];
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar6;
    local_1f0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1f0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string Runtime::Internal::valueToString(RegisterValue value, const Type* type) {
		std::stringstream stringstream;
		if (type->isReference()) {
			if (value == 0) {
				stringstream<< "nullref";
			} else {
				stringstream << "0x" << std::hex << value << std::dec;
			}
		} else if (type->name() == TypeSystem::toString(PrimitiveTypes::Float)) {
			int floatPattern = (int)value;
			float floatValue = *(reinterpret_cast<float*>(&floatPattern));
			stringstream << floatValue;
		} else {
			stringstream << value;
		}

		stringstream << " (" + type->name() + ")";
		return stringstream.str();
	}